

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,IOBlock *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  string indentation;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream result;
  
  if (numArrayElements < 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
    lVar2 = 0;
    for (lVar3 = 0;
        lVar3 < (int)(((long)(this->m_members).
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_members).
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar3 = lVar3 + 1) {
      std::operator+(&local_1e8,&this->m_interfaceName,"[gl_InvocationID].");
      std::operator+(&local_208,&local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->m_members).
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                     lVar2));
      glslTraverseBasicTypes
                (&indentation,&local_208,
                 (VarType *)
                 ((long)&(((this->m_members).
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type).m_type + lVar2),0,
                 indentationDepth,visit);
      std::operator<<((ostream *)&result,(string *)&indentation);
      std::__cxx11::string::~string((string *)&indentation);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      lVar2 = lVar2 + 0x38;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  }
  else {
    indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
    std::__cxx11::string::_M_construct((ulong)&indentation,(char)indentationDepth);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
    poVar1 = std::operator<<((ostream *)&result,(string *)&indentation);
    poVar1 = std::operator<<(poVar1,"for (int i0 = 0; i0 < ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,numArrayElements);
    poVar1 = std::operator<<(poVar1,"; ++i0)\n");
    poVar1 = std::operator<<(poVar1,(string *)&indentation);
    std::operator<<(poVar1,"{\n");
    lVar2 = 0;
    for (lVar3 = 0;
        lVar3 < (int)(((long)(this->m_members).
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_members).
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar3 = lVar3 + 1) {
      std::operator+(&local_1c8,&this->m_interfaceName,"[i0].");
      std::operator+(&local_1e8,&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->m_members).
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                     lVar2));
      glslTraverseBasicTypes
                (&local_208,&local_1e8,
                 (VarType *)
                 ((long)&(((this->m_members).
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type).m_type + lVar2),1,
                 indentationDepth + 1,visit);
      std::operator<<((ostream *)&result,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      lVar2 = lVar2 + 0x38;
    }
    std::operator+(&local_208,&indentation,"}\n");
    std::operator<<((ostream *)&result,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
    std::__cxx11::string::~string((string *)&indentation);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IOBlock::glslTraverseBasicTypeArray (const int numArrayElements, const int indentationDepth, BasicTypeVisitFunc visit) const
{
	if (numArrayElements >= 0)
	{
		const std::string	indentation = std::string(indentationDepth, '\t');
		std::ostringstream	result;

		result << indentation << "for (int i0 = 0; i0 < " << numArrayElements << "; ++i0)\n"
			   << indentation << "{\n";
		for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
			result << glslTraverseBasicTypes(m_interfaceName + "[i0]." + m_members[i].name, m_members[i].type, 1, indentationDepth + 1, visit);
		result << indentation + "}\n";
		return result.str();
	}
	else
	{
		std::ostringstream result;
		for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
			result << glslTraverseBasicTypes(m_interfaceName + "[gl_InvocationID]." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
		return result.str();
	}
}